

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_contracthashutil.cpp
# Opt level: O2

void __thiscall
ContractHashUtil_GetContractScriptFailFedpegScript_Test::TestBody
          (ContractHashUtil_GetContractScriptFailFedpegScript_Test *this)

{
  pointer pCVar1;
  bool bVar2;
  char *message;
  pointer hex;
  AssertHelper local_118;
  Script script;
  AssertionResult gtest_ar;
  Script local_a0;
  Script claim_script;
  
  std::__cxx11::string::string
            ((string *)&script,"0014fd1cd5452a43ca210ba7153d64227dc32acf6dbb",(allocator *)&local_a0
            );
  cfd::core::Script::Script(&claim_script,(string *)&script);
  std::__cxx11::string::~string((string *)&script);
  cfd::core::Script::Script(&script);
  pCVar1 = fedpeg_fail_test_vectors.
           super__Vector_base<CfdCoreTest_FedpegScriptData,_std::allocator<CfdCoreTest_FedpegScriptData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (hex = fedpeg_fail_test_vectors.
             super__Vector_base<CfdCoreTest_FedpegScriptData,_std::allocator<CfdCoreTest_FedpegScriptData>_>
             ._M_impl.super__Vector_impl_data._M_start; hex != pCVar1; hex = hex + 1) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        cfd::core::Script::Script((Script *)&gtest_ar,&hex->fedpeg_script);
        cfd::core::ContractHashUtil::GetContractScript(&local_a0,&claim_script,(Script *)&gtest_ar);
        cfd::core::Script::operator=(&script,&local_a0);
        cfd::core::Script::~Script(&local_a0);
        cfd::core::Script::~Script((Script *)&gtest_ar);
      }
    }
    else {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_contracthashutil.cpp"
                 ,100,
                 "Expected: (script = ContractHashUtil::GetContractScript(claim_script, Script(script_data.fedpeg_script))) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a0);
    }
    cfd::core::Script::GetHex_abi_cxx11_((string *)&local_a0,&script);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"script.GetHex().c_str()","script_data.contract_script.c_str()"
               ,(char *)local_a0._vptr_Script,(hex->contract_script)._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_a0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_contracthashutil.cpp"
                 ,0x65,message);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  cfd::core::Script::~Script(&script);
  cfd::core::Script::~Script(&claim_script);
  return;
}

Assistant:

TEST(ContractHashUtil, GetContractScriptFailFedpegScript) {
  Script claim_script("0014fd1cd5452a43ca210ba7153d64227dc32acf6dbb");
  Script script;
  for (const auto& script_data : fedpeg_fail_test_vectors) {
    EXPECT_NO_THROW(
        (script = ContractHashUtil::GetContractScript(claim_script,
            Script(script_data.fedpeg_script))));
    EXPECT_STREQ(script.GetHex().c_str(), script_data.contract_script.c_str());
  }
}